

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  long *in_RDI;
  int k;
  int local_14;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      if (*(long *)(*in_RDI + 0x80) != 0) {
        N_VDestroy(*(undefined8 *)(*in_RDI + 0x80));
        *(undefined8 *)(*in_RDI + 0x80) = 0;
      }
      if (*(long *)(*in_RDI + 0x90) != 0) {
        N_VDestroy(*(undefined8 *)(*in_RDI + 0x90));
        *(undefined8 *)(*in_RDI + 0x90) = 0;
      }
      if (*(long *)(*in_RDI + 0x60) != 0) {
        N_VDestroyVectorArray(*(undefined8 *)(*in_RDI + 0x60),*(int *)*in_RDI + 1);
        *(undefined8 *)(*in_RDI + 0x60) = 0;
      }
      if (*(long *)(*in_RDI + 0x68) != 0) {
        N_VDestroyVectorArray(*(undefined8 *)(*in_RDI + 0x68),*(int *)*in_RDI + 1);
        *(undefined8 *)(*in_RDI + 0x68) = 0;
      }
      if (*(long *)(*in_RDI + 0x70) != 0) {
        for (local_14 = 0; local_14 <= *(int *)*in_RDI; local_14 = local_14 + 1) {
          if (*(long *)(*(long *)(*in_RDI + 0x70) + (long)local_14 * 8) != 0) {
            free(*(void **)(*(long *)(*in_RDI + 0x70) + (long)local_14 * 8));
            *(undefined8 *)(*(long *)(*in_RDI + 0x70) + (long)local_14 * 8) = 0;
          }
        }
        free(*(void **)(*in_RDI + 0x70));
        *(undefined8 *)(*in_RDI + 0x70) = 0;
      }
      if (*(long *)(*in_RDI + 0x78) != 0) {
        free(*(void **)(*in_RDI + 0x78));
        *(undefined8 *)(*in_RDI + 0x78) = 0;
      }
      if (*(long *)(*in_RDI + 0x88) != 0) {
        free(*(void **)(*in_RDI + 0x88));
        *(undefined8 *)(*in_RDI + 0x88) = 0;
      }
      if (*(long *)(*in_RDI + 0x98) != 0) {
        free(*(void **)(*in_RDI + 0x98));
        *(undefined8 *)(*in_RDI + 0x98) = 0;
      }
      if (*(long *)(*in_RDI + 0xa0) != 0) {
        free(*(void **)(*in_RDI + 0xa0));
        *(undefined8 *)(*in_RDI + 0xa0) = 0;
      }
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) { return SUN_SUCCESS; }

  if (S->content)
  {
    /* delete items from within the content structure */
    if (SPFGMR_CONTENT(S)->xcor)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->xcor);
      SPFGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPFGMR_CONTENT(S)->vtemp)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
      SPFGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPFGMR_CONTENT(S)->V)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->V = NULL;
    }
    if (SPFGMR_CONTENT(S)->Z)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->Z = NULL;
    }
    if (SPFGMR_CONTENT(S)->Hes)
    {
      for (k = 0; k <= SPFGMR_CONTENT(S)->maxl; k++)
      {
        if (SPFGMR_CONTENT(S)->Hes[k])
        {
          free(SPFGMR_CONTENT(S)->Hes[k]);
          SPFGMR_CONTENT(S)->Hes[k] = NULL;
        }
      }
      free(SPFGMR_CONTENT(S)->Hes);
      SPFGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPFGMR_CONTENT(S)->givens)
    {
      free(SPFGMR_CONTENT(S)->givens);
      SPFGMR_CONTENT(S)->givens = NULL;
    }
    if (SPFGMR_CONTENT(S)->yg)
    {
      free(SPFGMR_CONTENT(S)->yg);
      SPFGMR_CONTENT(S)->yg = NULL;
    }
    if (SPFGMR_CONTENT(S)->cv)
    {
      free(SPFGMR_CONTENT(S)->cv);
      SPFGMR_CONTENT(S)->cv = NULL;
    }
    if (SPFGMR_CONTENT(S)->Xv)
    {
      free(SPFGMR_CONTENT(S)->Xv);
      SPFGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}